

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointObservationDiscrete.cpp
# Opt level: O0

void __thiscall
JointObservationDiscrete::AddIndividualObservation
          (JointObservationDiscrete *this,ObservationDiscrete *a,Index agentI)

{
  vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_> *this_00;
  vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_> *pvVar1;
  size_type sVar2;
  ostream *poVar3;
  void *this_01;
  uint in_EDX;
  long in_RSI;
  value_type *in_RDI;
  value_type *__x;
  ostream *in_stack_ffffffffffffffd0;
  
  this_00 = (vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_> *)
            (ulong)in_EDX;
  pvVar1 = (vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_> *)
           std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>::
           size((vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_> *
                )(in_RDI + 6));
  if (this_00 != pvVar1) {
    in_stack_ffffffffffffffd0 =
         std::operator<<((ostream *)&std::cout,
                         "WARNING! AddIndividualAction: size of _m_opVector does not match index of agent!\n _m_opVector.size()="
                        );
    sVar2 = std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>::
            size((vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
                  *)(in_RDI + 6));
    poVar3 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffd0,sVar2);
    poVar3 = std::operator<<(poVar3," - agentI=");
    this_01 = (void *)std::ostream::operator<<(poVar3,in_EDX);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  std::vector<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>::push_back
            (this_00,in_RDI);
  __x = in_RDI + 3;
  DiscreteEntity::GetIndex((DiscreteEntity *)(in_RSI + 0x48));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffd0,
             (value_type_conflict1 *)__x);
  return;
}

Assistant:

void JointObservationDiscrete::AddIndividualObservation(const ObservationDiscrete* a,  Index agentI)
{
    if (agentI != _m_opVector.size() )
    cout << "WARNING! AddIndividualAction: size of _m_opVector does not match index of agent!\n _m_opVector.size()="<< _m_opVector.size()<<" - agentI="<<agentI<<endl;    
    _m_opVector.push_back(a);
    _m_oIndexVector.push_back(a->GetIndex());
}